

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charls_jpegls_encoder.cpp
# Opt level: O3

void __thiscall
charls_jpegls_encoder::check_stride(charls_jpegls_encoder *this,size_t stride,size_t source_size)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  long extraout_RAX;
  long lVar6;
  ulong extraout_RDX;
  
  iVar1 = (this->frame_info_).bits_per_sample;
  iVar2 = iVar1 + 7;
  iVar1 = iVar1 + 0xe;
  if (-1 < iVar2) {
    iVar1 = iVar2;
  }
  iVar2 = (this->frame_info_).component_count;
  lVar6 = (long)iVar2;
  iVar3 = 1;
  if (this->interleave_mode_ != None) {
    iVar3 = iVar2;
  }
  uVar4 = (long)iVar3 * (ulong)(this->frame_info_).width * (ulong)(uint)(iVar1 >> 3);
  lVar5 = uVar4 - stride;
  if (uVar4 < stride || lVar5 == 0) {
    if (this->interleave_mode_ != None) {
      lVar6 = (this->frame_info_).height * stride;
      if ((ulong)(lVar5 + lVar6) <= source_size) {
        return;
      }
      check_stride();
      lVar5 = extraout_RAX;
      source_size = extraout_RDX;
    }
    if (lVar5 + (ulong)(this->frame_info_).height * lVar6 * stride <= source_size) {
      return;
    }
  }
  else {
    check_stride();
  }
  check_stride();
}

Assistant:

void check_stride(const size_t stride, const size_t source_size) const
    {
        const size_t minimum_stride{calculate_stride()};
        if (UNLIKELY(stride < minimum_stride))
            throw_jpegls_error(jpegls_errc::invalid_argument_stride);

        // Simple check to verify user input, and prevent out-of-bound read access.
        // Stride parameter defines the number of bytes on a scan line.
        if (interleave_mode_ == charls::interleave_mode::none)
        {
            const size_t minimum_source_size{stride * frame_info_.component_count * frame_info_.height - (stride - minimum_stride)};
            if (UNLIKELY(source_size < minimum_source_size))
                throw_jpegls_error(jpegls_errc::invalid_argument_stride);
        }
        else
        {
            const size_t minimum_source_size{stride * frame_info_.height - (stride - minimum_stride)};
            if (UNLIKELY(source_size < minimum_source_size))
                throw_jpegls_error(jpegls_errc::invalid_argument_stride);
        }
    }